

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TextureDerivateCase::TextureDerivateCase
          (TextureDerivateCase *this,Context *context,char *name,char *description,DerivateFunc func
          ,DataType type,Precision precision,deUint32 hint,SurfaceType surfaceType,int numSamples)

{
  DataType type_local;
  DerivateFunc func_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  TextureDerivateCase *this_local;
  
  TriangleDerivateCase::TriangleDerivateCase
            (&this->super_TriangleDerivateCase,context,name,description);
  (this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureDerivateCase_032af7f8;
  *(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4 = func;
  tcu::Vector<float,_4>::Vector(&this->m_texValueMin);
  tcu::Vector<float,_4>::Vector(&this->m_texValueMax);
  this->m_texture = (Texture2D *)0x0;
  (this->super_TriangleDerivateCase).m_dataType = type;
  (this->super_TriangleDerivateCase).m_precision = precision;
  (this->super_TriangleDerivateCase).m_coordDataType = TYPE_FLOAT_VEC2;
  (this->super_TriangleDerivateCase).m_coordPrecision = PRECISION_HIGHP;
  (this->super_TriangleDerivateCase).m_hint = hint;
  (this->super_TriangleDerivateCase).m_surfaceType = surfaceType;
  (this->super_TriangleDerivateCase).m_numSamples = numSamples;
  return;
}

Assistant:

TextureDerivateCase::TextureDerivateCase (Context& context, const char* name, const char* description, DerivateFunc func, glu::DataType type, glu::Precision precision, deUint32 hint, SurfaceType surfaceType, int numSamples)
	: TriangleDerivateCase	(context, name, description)
	, m_func				(func)
	, m_texture				(DE_NULL)
{
	m_dataType			= type;
	m_precision			= precision;
	m_coordDataType		= glu::TYPE_FLOAT_VEC2;
	m_coordPrecision	= glu::PRECISION_HIGHP;
	m_hint				= hint;
	m_surfaceType		= surfaceType;
	m_numSamples		= numSamples;
}